

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_job.cpp
# Opt level: O3

void __thiscall r_exec::SaliencyPropagationJob::report(SaliencyPropagationJob *this,int64_t lag)

{
  int iVar1;
  DebugStream local_59;
  char *local_58;
  long local_50;
  char local_48 [16];
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"saliency propagation job","")
  ;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_38,local_38 + local_30);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_58,local_50);
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"late:",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"us behind.",10);
    DebugStream::~DebugStream(&local_59);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void SaliencyPropagationJob::report(int64_t lag) const
{
    debug("saliency propagation job") << "late:" << lag << "us behind.";
}